

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void flatbuffers::IterateValue
               (ElementaryType type,uint8_t *val,TypeTable *type_table,uint8_t *prev_val,
               soffset_t vector_index,IterationVisitor *visitor)

{
  uchar uVar1;
  char tval_00;
  byte bVar2;
  short tval_01;
  unsigned_short tval_02;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  unsigned_long uVar7;
  uint8_t *obj;
  int64_t iVar8;
  TypeTable *type_table_00;
  uint *puVar9;
  TypeTable *ref;
  TypeCode type_code;
  int64_t type_code_idx;
  Vector<unsigned_char,_unsigned_int> *type_vec;
  uint8_t union_type;
  uint tval_6;
  int tval_5;
  unsigned_short tval_4;
  short tval_3;
  uchar tval_2;
  char tval_1;
  uchar tval;
  IterationVisitor *visitor_local;
  soffset_t vector_index_local;
  uint8_t *prev_val_local;
  TypeTable *type_table_local;
  uint8_t *val_local;
  ElementaryType type_local;
  
  puVar9 = &switchD_00234115::switchdataD_002962b0;
  switch(type) {
  case ET_UTYPE:
    bVar2 = ReadScalar<unsigned_char>(val);
    pcVar5 = EnumName<unsigned_char>(bVar2,type_table);
    (*visitor->_vptr_IterationVisitor[3])
              (visitor,(ulong)bVar2,pcVar5,CONCAT71((int7)((ulong)puVar9 >> 8),bVar2));
    break;
  case ET_BOOL:
    uVar1 = ReadScalar<unsigned_char>(val);
    (*visitor->_vptr_IterationVisitor[4])(visitor,(ulong)(uVar1 != '\0'));
    break;
  case ET_CHAR:
    tval_00 = ReadScalar<signed_char>(val);
    pcVar5 = EnumName<signed_char>(tval_00,type_table);
    (*visitor->_vptr_IterationVisitor[5])
              (visitor,(ulong)(uint)(int)tval_00,pcVar5,CONCAT71((int7)((ulong)puVar9 >> 8),tval_00)
              );
    break;
  case ET_UCHAR:
    bVar2 = ReadScalar<unsigned_char>(val);
    pcVar5 = EnumName<unsigned_char>(bVar2,type_table);
    (*visitor->_vptr_IterationVisitor[6])
              (visitor,(ulong)bVar2,pcVar5,CONCAT71((int7)((ulong)puVar9 >> 8),bVar2));
    break;
  case ET_SHORT:
    tval_01 = ReadScalar<short>(val);
    pcVar5 = EnumName<short>(tval_01,type_table);
    (*visitor->_vptr_IterationVisitor[7])
              (visitor,(ulong)(uint)(int)tval_01,pcVar5,
               CONCAT62((int6)((ulong)puVar9 >> 0x10),tval_01));
    break;
  case ET_USHORT:
    tval_02 = ReadScalar<unsigned_short>(val);
    pcVar5 = EnumName<unsigned_short>(tval_02,type_table);
    (*visitor->_vptr_IterationVisitor[8])
              (visitor,(ulong)tval_02,pcVar5,CONCAT62((int6)((ulong)puVar9 >> 0x10),tval_02));
    break;
  case ET_INT:
    uVar4 = ReadScalar<int>(val);
    pcVar5 = EnumName<int>(uVar4,type_table);
    (*visitor->_vptr_IterationVisitor[9])(visitor,(ulong)uVar4,pcVar5);
    break;
  case ET_UINT:
    uVar4 = ReadScalar<unsigned_int>(val);
    pcVar5 = EnumName<unsigned_int>(uVar4,type_table);
    (*visitor->_vptr_IterationVisitor[10])(visitor,(ulong)uVar4,pcVar5);
    break;
  case ET_LONG:
    lVar6 = ReadScalar<long>(val);
    (*visitor->_vptr_IterationVisitor[0xb])(visitor,lVar6);
    break;
  case ET_ULONG:
    uVar7 = ReadScalar<unsigned_long>(val);
    (*visitor->_vptr_IterationVisitor[0xc])(visitor,uVar7);
    break;
  case ET_FLOAT:
    ReadScalar<float>(val);
    (*visitor->_vptr_IterationVisitor[0xd])();
    break;
  case ET_DOUBLE:
    ReadScalar<double>(val);
    (*visitor->_vptr_IterationVisitor[0xe])();
    break;
  case ET_STRING:
    uVar4 = ReadScalar<unsigned_int>(val);
    (*visitor->_vptr_IterationVisitor[0xf])(visitor,val + uVar4);
    break;
  case ET_SEQUENCE:
    switch(type_table->st) {
    case ST_TABLE:
      uVar4 = ReadScalar<unsigned_int>(val);
      IterateObject(val + uVar4,type_table,visitor);
      break;
    case ST_STRUCT:
      IterateObject(val,type_table,visitor);
      break;
    case ST_UNION:
      uVar4 = ReadScalar<unsigned_int>(val);
      obj = val + uVar4;
      if (prev_val == (uint8_t *)0x0) {
        __assert_fail("prev_val",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/minireflect.h"
                      ,0xc2,
                      "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                     );
      }
      type_vec._7_1_ = *prev_val;
      if (-1 < vector_index) {
        type_vec._7_1_ =
             Vector<unsigned_char,_unsigned_int>::Get
                       ((Vector<unsigned_char,_unsigned_int> *)prev_val,vector_index);
      }
      iVar8 = LookupEnum((ulong)type_vec._7_1_,type_table->values,type_table->num_elems);
      if ((iVar8 < 0) || ((int)type_table->num_elems <= iVar8)) {
        (*visitor->_vptr_IterationVisitor[0x10])(visitor,obj);
      }
      else {
        uVar3 = (ushort)type_table->type_codes[iVar8] & 0xf;
        if (uVar3 == 0xc) {
          (*visitor->_vptr_IterationVisitor[0xf])(visitor,obj);
        }
        else if (uVar3 == 0xd) {
          type_table_00 = (*type_table->type_refs[(short)type_table->type_codes[iVar8] >> 5])();
          IterateObject(obj,type_table_00,visitor);
        }
        else {
          (*visitor->_vptr_IterationVisitor[0x10])(visitor,obj);
        }
      }
      break;
    case ST_ENUM:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/minireflect.h"
                    ,0xdd,
                    "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                   );
    }
    break;
  default:
    (*visitor->_vptr_IterationVisitor[0x10])(visitor,val);
  }
  return;
}

Assistant:

inline void IterateValue(ElementaryType type, const uint8_t *val,
                         const TypeTable *type_table, const uint8_t *prev_val,
                         soffset_t vector_index, IterationVisitor *visitor) {
  switch (type) {
    case ET_UTYPE: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UType(tval, EnumName(tval, type_table));
      break;
    }
    case ET_BOOL: {
      visitor->Bool(ReadScalar<uint8_t>(val) != 0);
      break;
    }
    case ET_CHAR: {
      auto tval = ReadScalar<int8_t>(val);
      visitor->Char(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UCHAR: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UChar(tval, EnumName(tval, type_table));
      break;
    }
    case ET_SHORT: {
      auto tval = ReadScalar<int16_t>(val);
      visitor->Short(tval, EnumName(tval, type_table));
      break;
    }
    case ET_USHORT: {
      auto tval = ReadScalar<uint16_t>(val);
      visitor->UShort(tval, EnumName(tval, type_table));
      break;
    }
    case ET_INT: {
      auto tval = ReadScalar<int32_t>(val);
      visitor->Int(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UINT: {
      auto tval = ReadScalar<uint32_t>(val);
      visitor->UInt(tval, EnumName(tval, type_table));
      break;
    }
    case ET_LONG: {
      visitor->Long(ReadScalar<int64_t>(val));
      break;
    }
    case ET_ULONG: {
      visitor->ULong(ReadScalar<uint64_t>(val));
      break;
    }
    case ET_FLOAT: {
      visitor->Float(ReadScalar<float>(val));
      break;
    }
    case ET_DOUBLE: {
      visitor->Double(ReadScalar<double>(val));
      break;
    }
    case ET_STRING: {
      val += ReadScalar<uoffset_t>(val);
      visitor->String(reinterpret_cast<const String *>(val));
      break;
    }
    case ET_SEQUENCE: {
      switch (type_table->st) {
        case ST_TABLE:
          val += ReadScalar<uoffset_t>(val);
          IterateObject(val, type_table, visitor);
          break;
        case ST_STRUCT: IterateObject(val, type_table, visitor); break;
        case ST_UNION: {
          val += ReadScalar<uoffset_t>(val);
          FLATBUFFERS_ASSERT(prev_val);
          auto union_type = *prev_val;  // Always a uint8_t.
          if (vector_index >= 0) {
            auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(prev_val);
            union_type = type_vec->Get(static_cast<uoffset_t>(vector_index));
          }
          auto type_code_idx =
              LookupEnum(union_type, type_table->values, type_table->num_elems);
          if (type_code_idx >= 0 &&
              type_code_idx < static_cast<int32_t>(type_table->num_elems)) {
            auto type_code = type_table->type_codes[type_code_idx];
            switch (type_code.base_type) {
              case ET_SEQUENCE: {
                auto ref = type_table->type_refs[type_code.sequence_ref]();
                IterateObject(val, ref, visitor);
                break;
              }
              case ET_STRING:
                visitor->String(reinterpret_cast<const String *>(val));
                break;
              default: visitor->Unknown(val);
            }
          } else {
            visitor->Unknown(val);
          }
          break;
        }
        case ST_ENUM: FLATBUFFERS_ASSERT(false); break;
      }
      break;
    }
    default: {
      visitor->Unknown(val);
      break;
    }
  }
}